

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_encoded_map_size
              (AMQP_MAP_KEY_VALUE_PAIR *pairs,uint32_t count,uint32_t *encoded_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  ulong uVar4;
  AMQP_VALUE *ppAVar5;
  size_t item_size;
  ulong local_30;
  
  if (encoded_size == (uint32_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xf83;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_map_size",0xf82,1,"Bad arguments: encoded_size = %p",0);
    }
  }
  else {
    *encoded_size = 0;
    if (count != 0) {
      ppAVar5 = &pairs->value;
      uVar4 = 0;
      do {
        iVar1 = amqpvalue_get_encoded_size
                          (((AMQP_MAP_KEY_VALUE_PAIR *)(ppAVar5 + -1))->key,&local_30);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0xfae;
          }
          pcVar3 = "Could not get encoded size for key element %u of the map";
          iVar1 = 0xf8f;
LAB_0010c903:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_map_size",iVar1,1,pcVar3);
          return 0xfae;
        }
        if ((local_30 >> 0x20 != 0) || (CARRY4((uint)local_30,*encoded_size))) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0xfae;
          }
          pcVar3 = "Encoded data is more than the max size for a map";
          iVar1 = 0xf96;
          goto LAB_0010c903;
        }
        *encoded_size = (uint)local_30 + *encoded_size;
        iVar1 = amqpvalue_get_encoded_size(*ppAVar5,&local_30);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0xfae;
          }
          pcVar3 = "Could not get encoded size for value element %u of the map";
          iVar1 = 0xf9e;
          goto LAB_0010c903;
        }
        if ((local_30 >> 0x20 != 0) || (CARRY4((uint)local_30,*encoded_size))) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0xfae;
          }
          pcVar3 = "Encoded data is more than the max size for a map";
          iVar1 = 0xfa5;
          goto LAB_0010c903;
        }
        *encoded_size = (uint)local_30 + *encoded_size;
        uVar4 = uVar4 + 1;
        ppAVar5 = ppAVar5 + 2;
      } while (count != uVar4);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int amqpvalue_get_encoded_map_size(AMQP_MAP_KEY_VALUE_PAIR* pairs, uint32_t count, uint32_t* encoded_size)
{
    size_t i;
    int result;

    if (encoded_size == NULL)
    {
        LogError("Bad arguments: encoded_size = %p", encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;

        /* Get the size of all items in the map */
        for (i = 0; i < count; i++)
        {
            size_t item_size;
            if (amqpvalue_get_encoded_size(pairs[i].key, &item_size) != 0)
            {
                LogError("Could not get encoded size for key element %u of the map", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Encoded data is more than the max size for a map");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);

            if (amqpvalue_get_encoded_size(pairs[i].value, &item_size) != 0)
            {
                LogError("Could not get encoded size for value element %u of the map", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Encoded data is more than the max size for a map");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);
        }

        if (i < count)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}